

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O1

TypeAliasType *
slang::ast::TypeAliasType::fromSyntax(Scope *scope,ClassPropertyDeclarationSyntax *syntax)

{
  short sVar1;
  size_t sVar2;
  pointer pTVar3;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  TypeAliasType *this;
  long lVar4;
  
  this = fromSyntax(scope,(TypedefDeclarationSyntax *)(syntax->declaration).ptr);
  sVar2 = (syntax->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar2 != 0) {
    pTVar3 = (syntax->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
    lVar4 = 0;
    do {
      sVar1 = *(short *)((long)&pTVar3->kind + lVar4);
      if (sVar1 == 0xf1) {
        this->visibility = Protected;
      }
      else if (sVar1 == 0xd1) {
        this->visibility = Local;
      }
      lVar4 = lVar4 + 0x10;
    } while (sVar2 << 4 != lVar4);
  }
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes((Symbol *)this,scope,syntax_00);
  return this;
}

Assistant:

TypeAliasType& TypeAliasType::fromSyntax(const Scope& scope,
                                         const ClassPropertyDeclarationSyntax& syntax) {
    auto& result = fromSyntax(scope, syntax.declaration->as<TypedefDeclarationSyntax>());
    for (Token qual : syntax.qualifiers) {
        switch (qual.kind) {
            case TokenKind::LocalKeyword:
                result.visibility = Visibility::Local;
                break;
            case TokenKind::ProtectedKeyword:
                result.visibility = Visibility::Protected;
                break;
            default:
                // Everything else is not allowed on typedefs; the parser will issue
                // a diagnostic so just ignore them here.
                break;
        }
    }

    result.setAttributes(scope, syntax.attributes);
    return result;
}